

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdGetConfidentialTxOutCount(void *handle,char *tx_hex_string,uint32_t *count)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  uint32_t *in_RDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext tx;
  string *in_stack_fffffffffffffe58;
  ConfidentialTransactionContext *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined8 in_stack_fffffffffffffe78;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe80;
  allocator *paVar4;
  allocator local_149;
  string local_148 [32];
  ConfidentialTransaction local_128 [2];
  undefined1 local_6a;
  allocator local_69;
  string local_68 [32];
  CfdSourceLocation local_48;
  uint32_t *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (!bVar1) {
    paVar4 = &local_149;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,local_18,paVar4);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    if (local_20 != (uint32_t *)0x0) {
      uVar2 = cfd::core::ConfidentialTransaction::GetTxOutCount(local_128);
      *local_20 = uVar2;
    }
    local_4 = 0;
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(in_stack_fffffffffffffe60);
    return local_4;
  }
  local_48.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
               ,0x2f);
  local_48.filename = local_48.filename + 1;
  local_48.line = 0x34a;
  local_48.funcname = "CfdGetConfidentialTxOutCount";
  cfd::core::logger::warn<>(&local_48,"tx is null or empty.");
  local_6a = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Failed to parameter. tx is null or empty.",&local_69);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffe80,error_code,
             (string *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  local_6a = 0;
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxOutCount(
    void* handle, const char* tx_hex_string, uint32_t* count) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionContext tx(tx_hex_string);

    if (count != nullptr) {
      *count = tx.GetTxOutCount();
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}